

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall VulkanHppGenerator::isHandleTypeByStructure(VulkanHppGenerator *this,string *type)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  const_reference pvVar5;
  bool local_66;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  _Self local_28;
  const_iterator structIt;
  string *type_local;
  VulkanHppGenerator *this_local;
  
  structIt._M_node = (_Base_ptr)type;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::find(&this->m_structs,type);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::end(&this->m_structs);
  bVar3 = std::operator==(&local_28,&local_30);
  bVar2 = false;
  bVar1 = false;
  local_66 = false;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
             ::operator->(&local_28);
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    bVar1 = true;
    bVar3 = describesVector(this,&ppVar4->second,&local_50);
    local_66 = false;
    if (bVar3) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
               ::operator->(&local_28);
      pvVar5 = std::
               vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ::operator[](&(ppVar4->second).members,3);
      local_66 = isHandleType(this,&(pvVar5->type).type);
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_51);
  }
  return local_66;
}

Assistant:

bool VulkanHppGenerator::isHandleTypeByStructure( std::string const & type ) const
{
  auto structIt = m_structs.find( type );
  return ( structIt != m_structs.end() ) && describesVector( structIt->second ) && isHandleType( structIt->second.members[3].type.type );
}